

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O3

void __thiscall
duckdb::ART::ART(ART *this,string *name,IndexConstraintType index_constraint_type,
                vector<unsigned_long,_true> *column_ids,TableIOManager *table_io_manager,
                vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *unbound_expressions,AttachedDatabase *db,
                shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
                *allocators_ptr,IndexStorageInfo *info)

{
  vector<duckdb::PhysicalType,_true> *this_00;
  value_type vVar1;
  byte bVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  FixedSizeAllocator *__ptr;
  int iVar3;
  reference pvVar4;
  ulong uVar5;
  undefined4 extraout_var;
  unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_> uVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  long lVar8;
  InvalidTypeException *this_02;
  reference type;
  array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>
  *__tmp;
  size_type __n;
  array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>
  allocator_array;
  BlockManager *block_manager;
  
  allocator_array._M_elems[0].
  super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
  .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl =
       (unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>)
       (allocator_array._M_elems + 2);
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&allocator_array,"ART","");
  BoundIndex::BoundIndex
            (&this->super_BoundIndex,name,(string *)&allocator_array,index_constraint_type,
             column_ids,table_io_manager,unbound_expressions,db);
  if (allocator_array._M_elems[0].
      super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
      .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl !=
      (unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>)
      (allocator_array._M_elems + 2)) {
    operator_delete((void *)allocator_array._M_elems[0].
                            super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
                            .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl
                   );
  }
  (this->super_BoundIndex).super_Index._vptr_Index = (_func_int **)&PTR__ART_02460488;
  (this->tree).super_IndexPointer.data = 0;
  (this->allocators).internal.
  super___shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (allocators_ptr->internal).
            super___shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  p_Var7 = (allocators_ptr->internal).
           super___shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->allocators).internal.
  super___shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var7;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    }
  }
  this->owns_data = false;
  this->verify_max_key_len = false;
  this_00 = &(this->super_BoundIndex).types;
  if ((this->super_BoundIndex).types.
      super_vector<duckdb::PhysicalType,_std::allocator<duckdb::PhysicalType>_>.
      super__Vector_base<duckdb::PhysicalType,_std::allocator<duckdb::PhysicalType>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->super_BoundIndex).types.
      super_vector<duckdb::PhysicalType,_std::allocator<duckdb::PhysicalType>_>.
      super__Vector_base<duckdb::PhysicalType,_std::allocator<duckdb::PhysicalType>_>._M_impl.
      super__Vector_impl_data._M_start) {
LAB_015a7715:
    pvVar4 = vector<duckdb::PhysicalType,_true>::operator[](this_00,0);
    if (*pvVar4 != VARCHAR) goto LAB_015a772b;
  }
  else {
    __n = 0;
    do {
      pvVar4 = vector<duckdb::PhysicalType,_true>::operator[](this_00,__n);
      vVar1 = *pvVar4;
      if (((0xc < vVar1) || ((0x1bfeU >> (vVar1 & 0x1f) & 1) == 0)) &&
         ((4 < vVar1 - 200 || ((0x19U >> (vVar1 - 200 & 0x1f) & 1) == 0)))) {
        this_02 = (InvalidTypeException *)__cxa_allocate_exception(0x10);
        type = vector<duckdb::LogicalType,_true>::operator[]
                         (&(this->super_BoundIndex).logical_types,__n);
        allocator_array._M_elems[0].
        super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
        .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl =
             (unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
              )(allocator_array._M_elems + 2);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&allocator_array,"Invalid type for index key.","");
        InvalidTypeException::InvalidTypeException(this_02,type,(string *)&allocator_array);
        __cxa_throw(this_02,&InvalidTypeException::typeinfo,::std::runtime_error::~runtime_error);
      }
      __n = __n + 1;
      uVar5 = (long)(this->super_BoundIndex).types.
                    super_vector<duckdb::PhysicalType,_std::allocator<duckdb::PhysicalType>_>.
                    super__Vector_base<duckdb::PhysicalType,_std::allocator<duckdb::PhysicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->super_BoundIndex).types.
                    super_vector<duckdb::PhysicalType,_std::allocator<duckdb::PhysicalType>_>.
                    super__Vector_base<duckdb::PhysicalType,_std::allocator<duckdb::PhysicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start;
    } while (__n < uVar5);
    if (uVar5 < 2) goto LAB_015a7715;
  }
  this->verify_max_key_len = true;
LAB_015a772b:
  SetPrefixCount(this,info);
  if ((this->allocators).internal.
      super___shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    this->owns_data = true;
    bVar2 = this->prefix_count;
    iVar3 = (*table_io_manager->_vptr_TableIOManager[2])(table_io_manager);
    block_manager = (BlockManager *)CONCAT44(extraout_var,iVar3);
    uVar6._M_t.
    super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
    .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_true,_true>
          )operator_new(0xe8);
    FixedSizeAllocator::FixedSizeAllocator
              ((FixedSizeAllocator *)
               uVar6._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl,
               (ulong)bVar2 + 9,block_manager);
    allocator_array._M_elems[0].
    super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
    .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl =
         (unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>)
         (unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>)
         uVar6._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    uVar6._M_t.
    super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
    .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_true,_true>
          )operator_new(0xe8);
    FixedSizeAllocator::FixedSizeAllocator
              ((FixedSizeAllocator *)
               uVar6._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl,0x30,
               block_manager);
    allocator_array._M_elems[1].
    super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
    .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl =
         (unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>)
         (unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>)
         uVar6._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    uVar6._M_t.
    super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
    .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_true,_true>
          )operator_new(0xe8);
    FixedSizeAllocator::FixedSizeAllocator
              ((FixedSizeAllocator *)
               uVar6._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl,0x28,
               block_manager);
    allocator_array._M_elems[2].
    super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
    .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl =
         (unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>)
         (unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>)
         uVar6._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    uVar6._M_t.
    super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
    .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_true,_true>
          )operator_new(0xe8);
    FixedSizeAllocator::FixedSizeAllocator
              ((FixedSizeAllocator *)
               uVar6._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl,0x98,
               block_manager);
    allocator_array._M_elems[3].
    super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
    .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl =
         (unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>)
         (unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>)
         uVar6._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    uVar6._M_t.
    super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
    .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_true,_true>
          )operator_new(0xe8);
    FixedSizeAllocator::FixedSizeAllocator
              ((FixedSizeAllocator *)
               uVar6._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl,0x288,
               block_manager);
    allocator_array._M_elems[4].
    super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
    .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl =
         (unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>)
         (unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>)
         uVar6._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    uVar6._M_t.
    super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
    .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_true,_true>
          )operator_new(0xe8);
    FixedSizeAllocator::FixedSizeAllocator
              ((FixedSizeAllocator *)
               uVar6._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl,0x808,
               block_manager);
    allocator_array._M_elems[5].
    super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
    .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl =
         (unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>)
         (unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>)
         uVar6._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    uVar6._M_t.
    super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
    .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_true,_true>
          )operator_new(0xe8);
    FixedSizeAllocator::FixedSizeAllocator
              ((FixedSizeAllocator *)
               uVar6._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl,8,
               block_manager);
    allocator_array._M_elems[6].
    super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
    .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl =
         (unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>)
         (unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>)
         uVar6._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    uVar6._M_t.
    super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
    .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_true,_true>
          )operator_new(0xe8);
    FixedSizeAllocator::FixedSizeAllocator
              ((FixedSizeAllocator *)
               uVar6._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl,0x10,
               block_manager);
    allocator_array._M_elems[7].
    super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
    .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl =
         (unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>)
         (unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>)
         uVar6._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    uVar6._M_t.
    super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
    .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_true,_true>
          )operator_new(0xe8);
    FixedSizeAllocator::FixedSizeAllocator
              ((FixedSizeAllocator *)
               uVar6._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl,0x108,
               block_manager);
    allocator_array._M_elems[8].
    super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
    .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl =
         (unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>)
         (unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>)
         uVar6._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
    p_Var7->_M_use_count = 1;
    p_Var7->_M_weak_count = 1;
    p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_024605b8;
    lVar8 = 0;
    do {
      (&p_Var7[1]._vptr__Sp_counted_base)[lVar8] =
           (_func_int **)
           allocator_array._M_elems[lVar8].
           super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
           .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>;
      allocator_array._M_elems[lVar8].
      super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
      .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> =
           (_Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>)0x0;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 9);
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var7->_M_use_count = 2;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
    (this->allocators).internal.
    super___shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)(p_Var7 + 1);
    this_01 = (this->allocators).internal.
              super___shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    (this->allocators).internal.
    super___shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var7;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    lVar8 = 0x40;
    do {
      __ptr = *(FixedSizeAllocator **)
               ((long)&allocator_array._M_elems[0].
                       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
                       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl +
               lVar8);
      if (__ptr != (FixedSizeAllocator *)0x0) {
        ::std::default_delete<duckdb::FixedSizeAllocator>::operator()
                  ((default_delete<duckdb::FixedSizeAllocator> *)
                   ((long)&allocator_array._M_elems[0].
                           super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
                           .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl
                   + lVar8),__ptr);
      }
      *(undefined8 *)
       ((long)&allocator_array._M_elems[0].
               super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl + lVar8) = 0
      ;
      lVar8 = lVar8 + -8;
    } while (lVar8 != -8);
  }
  lVar8 = (info->root_block_ptr).block_id;
  if ((lVar8 != -1) ||
     ((info->allocator_infos).
      super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>.
      super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (info->allocator_infos).
      super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>.
      super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    if (lVar8 == -1) {
      (this->tree).super_IndexPointer.data = info->root;
      InitAllocators(this,info);
    }
    else {
      Deserialize(this,&info->root_block_ptr);
    }
  }
  return;
}

Assistant:

ART::ART(const string &name, const IndexConstraintType index_constraint_type, const vector<column_t> &column_ids,
         TableIOManager &table_io_manager, const vector<unique_ptr<Expression>> &unbound_expressions,
         AttachedDatabase &db,
         const shared_ptr<array<unsafe_unique_ptr<FixedSizeAllocator>, ALLOCATOR_COUNT>> &allocators_ptr,
         const IndexStorageInfo &info)
    : BoundIndex(name, ART::TYPE_NAME, index_constraint_type, column_ids, table_io_manager, unbound_expressions, db),
      allocators(allocators_ptr), owns_data(false), verify_max_key_len(false) {

	// FIXME: Use the new byte representation function to support nested types.
	for (idx_t i = 0; i < types.size(); i++) {
		switch (types[i]) {
		case PhysicalType::BOOL:
		case PhysicalType::INT8:
		case PhysicalType::INT16:
		case PhysicalType::INT32:
		case PhysicalType::INT64:
		case PhysicalType::INT128:
		case PhysicalType::UINT8:
		case PhysicalType::UINT16:
		case PhysicalType::UINT32:
		case PhysicalType::UINT64:
		case PhysicalType::UINT128:
		case PhysicalType::FLOAT:
		case PhysicalType::DOUBLE:
		case PhysicalType::VARCHAR:
			break;
		default:
			throw InvalidTypeException(logical_types[i], "Invalid type for index key.");
		}
	}

	if (types.size() > 1) {
		verify_max_key_len = true;
	} else if (types[0] == PhysicalType::VARCHAR) {
		verify_max_key_len = true;
	}

	// Initialize the allocators.
	SetPrefixCount(info);
	if (!allocators) {
		owns_data = true;
		auto prefix_size = NumericCast<idx_t>(prefix_count) + NumericCast<idx_t>(Prefix::METADATA_SIZE);
		auto &block_manager = table_io_manager.GetIndexBlockManager();

		array<unsafe_unique_ptr<FixedSizeAllocator>, ALLOCATOR_COUNT> allocator_array = {
		    make_unsafe_uniq<FixedSizeAllocator>(prefix_size, block_manager),
		    make_unsafe_uniq<FixedSizeAllocator>(sizeof(Leaf), block_manager),
		    make_unsafe_uniq<FixedSizeAllocator>(sizeof(Node4), block_manager),
		    make_unsafe_uniq<FixedSizeAllocator>(sizeof(Node16), block_manager),
		    make_unsafe_uniq<FixedSizeAllocator>(sizeof(Node48), block_manager),
		    make_unsafe_uniq<FixedSizeAllocator>(sizeof(Node256), block_manager),
		    make_unsafe_uniq<FixedSizeAllocator>(sizeof(Node7Leaf), block_manager),
		    make_unsafe_uniq<FixedSizeAllocator>(sizeof(Node15Leaf), block_manager),
		    make_unsafe_uniq<FixedSizeAllocator>(sizeof(Node256Leaf), block_manager),
		};
		allocators =
		    make_shared_ptr<array<unsafe_unique_ptr<FixedSizeAllocator>, ALLOCATOR_COUNT>>(std::move(allocator_array));
	}

	if (!info.IsValid()) {
		// We create a new ART.
		return;
	}

	if (info.root_block_ptr.IsValid()) {
		// Backwards compatibility.
		Deserialize(info.root_block_ptr);
		return;
	}

	// Set the root node and initialize the allocators.
	tree.Set(info.root);
	InitAllocators(info);
}